

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vhost.c
# Opt level: O0

void * lws_protocol_vh_priv_zalloc(lws_vhost *vhost,lws_protocols *prot,int size)

{
  int iVar1;
  void **ppvVar2;
  lws_log_cx *cx;
  void *pvVar3;
  bool bVar4;
  int local_28;
  int n;
  int size_local;
  lws_protocols *prot_local;
  lws_vhost *vhost_local;
  
  local_28 = 0;
  if ((((vhost == (lws_vhost *)0x0) || (prot == (lws_protocols *)0x0)) ||
      (vhost->protocols == (lws_protocols *)0x0)) || (prot->name == (char *)0x0)) {
    vhost_local = (lws_vhost *)0x0;
  }
  else {
    if (vhost->protocol_vh_privs == (void **)0x0) {
      ppvVar2 = (void **)lws_zalloc((long)vhost->count_protocols << 3,"protocol_vh_privs");
      vhost->protocol_vh_privs = ppvVar2;
      if (vhost->protocol_vh_privs == (void **)0x0) {
        return (void *)0x0;
      }
    }
    while( true ) {
      bVar4 = false;
      if (local_28 < vhost->count_protocols) {
        bVar4 = vhost->protocols + local_28 != prot;
      }
      if (!bVar4) break;
      local_28 = local_28 + 1;
    }
    if (local_28 == vhost->count_protocols) {
      local_28 = 0;
      while ((local_28 < vhost->count_protocols &&
             ((vhost->protocols[local_28].name == (char *)0x0 ||
              (iVar1 = strcmp(vhost->protocols[local_28].name,prot->name), iVar1 != 0))))) {
        local_28 = local_28 + 1;
      }
      if (local_28 == vhost->count_protocols) {
        cx = lwsl_vhost_get_cx(vhost);
        _lws_log_cx(cx,lws_log_prepend_vhost,vhost,1,"lws_protocol_vh_priv_zalloc",
                    "unknown protocol %p",prot);
        return (void *)0x0;
      }
    }
    pvVar3 = lws_zalloc((long)size,"vh priv");
    vhost->protocol_vh_privs[local_28] = pvVar3;
    vhost_local = (lws_vhost *)vhost->protocol_vh_privs[local_28];
  }
  return vhost_local;
}

Assistant:

void *
lws_protocol_vh_priv_zalloc(struct lws_vhost *vhost,
			    const struct lws_protocols *prot, int size)
{
	int n = 0;

	if (!vhost || !prot || !vhost->protocols || !prot->name)
		return NULL;

	/* allocate the vh priv array only on demand */
	if (!vhost->protocol_vh_privs) {
		vhost->protocol_vh_privs = (void **)lws_zalloc(
				(size_t)vhost->count_protocols * sizeof(void *),
				"protocol_vh_privs");

		if (!vhost->protocol_vh_privs)
			return NULL;
	}

	while (n < vhost->count_protocols && &vhost->protocols[n] != prot)
		n++;

	if (n == vhost->count_protocols) {
		n = 0;
		while (n < vhost->count_protocols) {
			if (vhost->protocols[n].name &&
			    !strcmp(vhost->protocols[n].name, prot->name))
				break;
			n++;
		}

		if (n == vhost->count_protocols) {
			lwsl_vhost_err(vhost, "unknown protocol %p", prot);
			return NULL;
		}
	}

	vhost->protocol_vh_privs[n] = lws_zalloc((size_t)size, "vh priv");
	return vhost->protocol_vh_privs[n];
}